

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  undefined1 auVar1 [16];
  Symbol SVar2;
  
  SVar2 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  if (SVar2.type == NULL_SYMBOL) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SVar2.field_1;
    SVar2 = (Symbol)(auVar1 << 0x40);
    if (this->pool_->allow_unknown_ == true) {
      SVar2 = DescriptorPool::NewPlaceholderWithMutexHeld(this->pool_,name,placeholder_type);
    }
  }
  return SVar2;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}